

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O1

bool COST_SENSITIVE::ec_is_example_header(example *ec)

{
  wclass *pwVar1;
  
  pwVar1 = (ec->l).cs.costs._begin;
  if (((long)(ec->l).cs.costs._end - (long)pwVar1 == 0x10) && (pwVar1->class_index == 0)) {
    return (bool)(-(pwVar1->x == -3.4028235e+38) & 1);
  }
  return false;
}

Assistant:

bool ec_is_example_header(example& ec)  // example headers look like "0:-1" or just "shared"
{
  v_array<COST_SENSITIVE::wclass> costs = ec.l.cs.costs;
  if (costs.size() != 1)
    return false;
  if (costs[0].class_index != 0)
    return false;
  if (costs[0].x != -FLT_MAX)
    return false;
  return true;
}